

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall slang::ast::TypePrinter::append(TypePrinter *this,Type *type)

{
  string_view *psVar1;
  string_view str;
  Type *this_00;
  pointer pFVar2;
  string_view local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  size_t local_38;
  char *local_30;
  string_view local_28;
  Type *local_18;
  Type *type_local;
  TypePrinter *this_local;
  
  local_18 = type;
  type_local = (Type *)this;
  if (((this->options).addSingleQuotes & 1U) != 0) {
    pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"\'");
    FormatBuffer::append(pFVar2,local_28);
  }
  this_00 = local_18;
  if ((((this->options).printAKA & 1U) == 0) || ((local_18->super_Symbol).kind != TypeAlias)) {
    local_48 = sv("",0);
    Symbol::visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
              (&this_00->super_Symbol,this,&local_48);
  }
  else {
    pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    psVar1 = &(local_18->super_Symbol).name;
    local_38 = psVar1->_M_len;
    local_30 = (local_18->super_Symbol).name._M_str;
    str._M_len = psVar1->_M_len;
    str._M_str = psVar1->_M_str;
    FormatBuffer::append(pFVar2,str);
  }
  if (((this->options).addSingleQuotes & 1U) != 0) {
    pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"\'");
    FormatBuffer::append(pFVar2,local_58);
  }
  if ((((this->options).printAKA & 1U) != 0) && ((local_18->super_Symbol).kind == TypeAlias)) {
    printAKA(this,local_18);
  }
  return;
}

Assistant:

void TypePrinter::append(const Type& type) {
    if (options.addSingleQuotes)
        buffer->append("'");

    if (options.printAKA && type.kind == SymbolKind::TypeAlias)
        buffer->append(type.name);
    else
        type.visit(*this, ""sv);

    if (options.addSingleQuotes)
        buffer->append("'");

    if (options.printAKA && type.kind == SymbolKind::TypeAlias)
        printAKA(type);
}